

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O0

Trivia __thiscall
slang::parsing::Preprocessor::handleIfDefDirective(Preprocessor *this,Token directive,bool inverted)

{
  Token directive_00;
  Token directive_01;
  undefined1 auVar1 [14];
  byte taken;
  bool bVar2;
  reference pBVar3;
  byte in_CL;
  Preprocessor *in_RDX;
  Preprocessor *in_RSI;
  ConditionalDirectiveExpressionSyntax *in_RDI;
  Trivia TVar4;
  Preprocessor *in_stack_00000018;
  bool take;
  ConditionalDirectiveExpressionSyntax *expr;
  BranchEntry *args;
  SmallVectorBase<slang::parsing::Preprocessor::BranchEntry> *this_00;
  byte local_39;
  ConditionalDirectiveExpressionSyntax *local_38;
  ConditionalDirectiveExpressionSyntax *expr_00;
  undefined6 in_stack_fffffffffffffff0;
  undefined2 in_stack_fffffffffffffff6;
  undefined2 uStack_2;
  
  taken = in_CL & 1;
  expr_00 = in_RDI;
  local_38 = parseConditionalExprTop(in_stack_00000018);
  local_39 = 0;
  bVar2 = SmallVectorBase<slang::parsing::Preprocessor::BranchEntry>::empty
                    ((SmallVectorBase<slang::parsing::Preprocessor::BranchEntry> *)(in_RDI + 0xc));
  if (((bVar2) ||
      (pBVar3 = SmallVectorBase<slang::parsing::Preprocessor::BranchEntry>::back
                          ((SmallVectorBase<slang::parsing::Preprocessor::BranchEntry> *)
                           (in_RDI + 0xc)), (pBVar3->currentActive & 1U) != 0)) &&
     (local_39 = evalConditionalExpr(in_RDX,(ConditionalDirectiveExpressionSyntax *)in_RSI),
     (taken & 1) != 0)) {
    local_39 = (local_39 ^ 0xff) & 1;
  }
  args = (BranchEntry *)(in_RDI + 0xc);
  directive_00.info = (Info *)in_RDX;
  directive_00._0_8_ = in_RSI;
  this_00 = (SmallVectorBase<slang::parsing::Preprocessor::BranchEntry> *)&stack0xffffffffffffffa8;
  BranchEntry::BranchEntry((BranchEntry *)this_00,directive_00,(bool)(local_39 & 1));
  SmallVectorBase<slang::parsing::Preprocessor::BranchEntry>::
  emplace_back<slang::parsing::Preprocessor::BranchEntry>(this_00,args);
  directive_01.info._0_6_ = in_stack_fffffffffffffff0;
  directive_01._0_8_ = in_RDX;
  directive_01.info._6_2_ = in_stack_fffffffffffffff6;
  TVar4 = parseBranchDirective(in_RSI,directive_01,expr_00,(bool)taken);
  auVar1 = TVar4._0_14_;
  TVar4._14_2_ = uStack_2;
  TVar4.field_0 = (anon_union_12_4_39e54f29_for_Trivia_0)auVar1._0_12_;
  TVar4.hasFullLocation = (bool)auVar1[0xc];
  TVar4.kind = auVar1[0xd];
  return TVar4;
}

Assistant:

Trivia Preprocessor::handleIfDefDirective(Token directive, bool inverted) {
    auto& expr = parseConditionalExprTop();
    bool take = false;
    if (branchStack.empty() || branchStack.back().currentActive) {
        // decide whether the branch is taken or skipped
        take = evalConditionalExpr(expr);
        if (inverted)
            take = !take;
    }

    branchStack.emplace_back(BranchEntry(directive, take));

    return parseBranchDirective(directive, &expr, take);
}